

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

int __thiscall Js::ConcatStringBuilder::GetItemCount(ConcatStringBuilder *this)

{
  ConcatStringBuilder **ppCVar1;
  ConcatStringBuilder *local_20;
  ConcatStringBuilder *current;
  int count;
  ConcatStringBuilder *this_local;
  
  current._4_4_ = 0;
  local_20 = this;
  while (local_20 != (ConcatStringBuilder *)0x0) {
    current._4_4_ = local_20->m_count + current._4_4_;
    ppCVar1 = Memory::WriteBarrierPtr::operator_cast_to_ConcatStringBuilder__
                        ((WriteBarrierPtr *)&local_20->m_prevChunk);
    local_20 = *ppCVar1;
  }
  return current._4_4_;
}

Assistant:

int ConcatStringBuilder::GetItemCount() const
    {
        int count = 0;
        const ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            count += current->m_count;
            current = current->m_prevChunk;
        }
        return count;
    }